

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.cc
# Opt level: O0

int hexdump_write(hexdump_ctx *ctx,uint8_t *data,size_t len)

{
  char cVar1;
  int iVar2;
  ulong local_40;
  size_t i;
  uint l;
  char acStack_2c [2];
  char buf [10];
  size_t len_local;
  uint8_t *data_local;
  hexdump_ctx *ctx_local;
  
  local_40 = 0;
  buf._2_8_ = len;
  while( true ) {
    if ((ulong)buf._2_8_ <= local_40) {
      return 1;
    }
    if (ctx->used == 0) {
      BIO_indent((BIO *)ctx->bio,ctx->indent,-1);
      hexbyte((char *)((long)&i + 6),(uint8_t)(ctx->n >> 0x18));
      hexbyte((char *)&l,(uint8_t)(ctx->n >> 0x10));
      hexbyte((char *)((long)&l + 2),(uint8_t)(ctx->n >> 8));
      hexbyte(acStack_2c,(uint8_t)ctx->n);
      buf[1] = ' ';
      buf[0] = ' ';
      iVar2 = BIO_write((BIO *)ctx->bio,(void *)((long)&i + 6),10);
      if (iVar2 < 0) {
        return 0;
      }
    }
    hexbyte((char *)((long)&i + 6),data[local_40]);
    l._0_1_ = 0x20;
    i._0_4_ = 3;
    if (ctx->used == 7) {
      l._1_1_ = 0x20;
      i._0_4_ = 4;
    }
    else if (ctx->used == 0xf) {
      l._1_1_ = 0x20;
      l._2_1_ = 0x7c;
      i._0_4_ = 5;
    }
    iVar2 = BIO_write((BIO *)ctx->bio,(void *)((long)&i + 6),(int)i);
    if (iVar2 < 0) break;
    cVar1 = to_char(data[local_40]);
    ctx->right_chars[ctx->used] = cVar1;
    ctx->used = ctx->used + 1;
    ctx->n = ctx->n + 1;
    if (ctx->used == 0x10) {
      ctx->right_chars[0x10] = '|';
      ctx->right_chars[0x11] = '\n';
      iVar2 = BIO_write((BIO *)ctx->bio,ctx->right_chars,0x12);
      if (iVar2 < 0) {
        return 0;
      }
      ctx->used = 0;
    }
    local_40 = local_40 + 1;
  }
  return 0;
}

Assistant:

static int hexdump_write(struct hexdump_ctx *ctx, const uint8_t *data,
                         size_t len) {
  char buf[10];
  unsigned l;

  // Output lines look like:
  // 00000010  2e 2f 30 31 32 33 34 35  36 37 38 ... 3c 3d // |./0123456789:;<=|
  // ^ offset                          ^ extra space           ^ ASCII of line

  for (size_t i = 0; i < len; i++) {
    if (ctx->used == 0) {
      // The beginning of a line.
      BIO_indent(ctx->bio, ctx->indent, UINT_MAX);

      hexbyte(&buf[0], ctx->n >> 24);
      hexbyte(&buf[2], ctx->n >> 16);
      hexbyte(&buf[4], ctx->n >> 8);
      hexbyte(&buf[6], ctx->n);
      buf[8] = buf[9] = ' ';
      if (BIO_write(ctx->bio, buf, 10) < 0) {
        return 0;
      }
    }

    hexbyte(buf, data[i]);
    buf[2] = ' ';
    l = 3;
    if (ctx->used == 7) {
      // There's an additional space after the 8th byte.
      buf[3] = ' ';
      l = 4;
    } else if (ctx->used == 15) {
      // At the end of the line there's an extra space and the bar for the
      // right column.
      buf[3] = ' ';
      buf[4] = '|';
      l = 5;
    }

    if (BIO_write(ctx->bio, buf, l) < 0) {
      return 0;
    }
    ctx->right_chars[ctx->used] = to_char(data[i]);
    ctx->used++;
    ctx->n++;
    if (ctx->used == 16) {
      ctx->right_chars[16] = '|';
      ctx->right_chars[17] = '\n';
      if (BIO_write(ctx->bio, ctx->right_chars, sizeof(ctx->right_chars)) < 0) {
        return 0;
      }
      ctx->used = 0;
    }
  }

  return 1;
}